

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O3

QpVector * __thiscall MatrixBase::mat_vec_seq(MatrixBase *this,QpVector *other,QpVector *target)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer piVar6;
  pointer piVar7;
  pointer pdVar8;
  pointer pdVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  if (0 < target->num_nz) {
    piVar4 = (target->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (target->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar10 = 0;
    do {
      pdVar5[piVar4[lVar10]] = 0.0;
      piVar4[lVar10] = 0;
      lVar10 = lVar10 + 1;
    } while (lVar10 < target->num_nz);
  }
  target->num_nz = 0;
  iVar1 = other->num_nz;
  if (0 < (long)iVar1) {
    piVar4 = (other->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (other->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (this->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (target->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar10 = 0;
    do {
      lVar11 = (long)piVar4[lVar10];
      iVar2 = piVar6[lVar11];
      lVar12 = (long)iVar2;
      iVar3 = piVar6[lVar11 + 1];
      if (iVar2 < iVar3) {
        do {
          iVar2 = piVar7[lVar12];
          pdVar9[iVar2] = pdVar8[lVar12] * pdVar5[lVar11] + pdVar9[iVar2];
          lVar12 = lVar12 + 1;
        } while (iVar3 != lVar12);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != iVar1);
  }
  QpVector::resparsify(target);
  return target;
}

Assistant:

QpVector& mat_vec_seq(const QpVector& other, QpVector& target) const {
    target.reset();
    for (HighsInt i = 0; i < other.num_nz; i++) {
      HighsInt col = other.index[i];
      for (HighsInt idx = start[col]; idx < start[col + 1]; idx++) {
        HighsInt row = index[idx];
        target.value[row] += value[idx] * other.value[col];
      }
    }
    target.resparsify();
    return target;
  }